

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O0

double __thiscall
imrt::ApertureILS::openBeamlet
          (ApertureILS *this,int beamlet,int aperture,Station *station,double c_eval,Plan *P)

{
  size_type sVar1;
  Plan *in_RCX;
  undefined4 in_ESI;
  Station *in_R8;
  double in_XMM0_Qa;
  double dVar2;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *this_00;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> diff;
  double aux_eval;
  undefined8 in_stack_ffffffffffffff58;
  int aperture_00;
  Station *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff78;
  Station *in_stack_ffffffffffffff88;
  Station *in_stack_ffffffffffffff90;
  undefined8 local_8;
  
  aperture_00 = (int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::list
            ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x15fe36);
  dVar2 = Station::getApertureIntensity(in_stack_ffffffffffffff60,aperture_00);
  this_00 = (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
            Plan::get_delta_eval
                      ((Plan *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                       (int)((ulong)dVar2 >> 0x20),
                       (double)CONCAT44(in_ESI,in_stack_ffffffffffffff78),
                       (int)((ulong)in_RCX >> 0x20));
  local_8 = in_XMM0_Qa;
  if ((double)this_00 <= in_XMM0_Qa) {
    Station::openBeamlet_abi_cxx11_(station,c_eval._4_4_,c_eval._0_4_);
    std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)in_RCX,
               (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)in_R8);
    std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~list
              ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x15ff29);
    sVar1 = std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
            size(this_00);
    if (sVar1 != 0) {
      local_8 = Plan::incremental_eval(in_RCX,in_R8,this_00);
    }
  }
  else {
    Station::clearHistory(in_stack_ffffffffffffff90);
  }
  std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~list
            ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x15ffa5);
  return local_8;
}

Assistant:

double ApertureILS::openBeamlet(int beamlet, int aperture, Station& station, double c_eval, Plan& P) {
  double aux_eval=0;
  list<pair<int, double> > diff;
  
  if (P.get_delta_eval(station, beamlet, station.getApertureIntensity(aperture)) > c_eval){
    station.clearHistory();
    return(c_eval);
  }

  diff = station.openBeamlet(beamlet, aperture);
  if(diff.size() <1) return(c_eval);
  c_eval = P.incremental_eval(station, diff);

  return(c_eval);
}